

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

void __thiscall SQArray::~SQArray(SQArray *this)

{
  SQCollectable_conflict *in_RDI;
  
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQArray_00157048;
  if (((in_RDI->super_SQRefCounted)._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  }
  sqvector<SQObjectPtr>::~sqvector((sqvector<SQObjectPtr> *)in_RDI);
  SQCollectable::~SQCollectable((SQCollectable *)0x1277b6);
  return;
}

Assistant:

~SQArray()
    {
        REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this);
    }